

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLExtraDataLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::ExtraDataLoader::base__begin__technique
          (ExtraDataLoader *this,technique__AttributeData *attributeData,UniqueId *uniqueId,
          Object *object)

{
  byte bVar1;
  DocumentProcessor *this_00;
  const_reference ppIVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool parseElement;
  ParserChar *profileName;
  StringHash elementHash;
  size_t level;
  IExtraDataCallbackHandler *extraDataCallbackHandler;
  size_t i;
  size_t numHandlers;
  ExtraDataCallbackHandlerList *extraDataCallbackHandlerList;
  ExtraDataElementHandler *extraDataElementHandler;
  undefined7 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9f;
  ExtraDataElementHandler *this_01;
  StringHash local_58 [2];
  value_type local_48;
  ulong local_40;
  ulong local_38;
  ExtraDataCallbackHandlerList *local_30;
  ExtraDataElementHandler *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = (DocumentProcessor *)(**(code **)(*in_RDI + 0x10))();
  local_28 = DocumentProcessor::getExtraDataElementHandler(this_00);
  local_30 = ExtraDataElementHandler::getExtraDataCallbackHandlerList(local_28);
  local_38 = std::
             vector<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
             ::size(local_30);
  for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
    ppIVar2 = std::
              vector<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
              ::operator[](local_30,local_40);
    local_48 = *ppIVar2;
    local_58[1] = 1;
    (**(code **)(*in_RDI + 0x10))();
    local_58[0] = FileLoader::getElementHash
                            ((FileLoader *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                             (size_t)in_RDI);
    this_01 = (ExtraDataElementHandler *)*local_10;
    bVar1 = (**(code **)(*(long *)local_48 + 0x28))(local_48,this_01,local_58,local_18,local_20);
    in_stack_ffffffffffffff9f = bVar1 & 1;
    ExtraDataElementHandler::setExtraDataCallbackHandlerCalling
              (this_01,CONCAT17(bVar1,in_stack_ffffffffffffff98) & 0x1ffffffffffffff,
               SUB81((ulong)in_RDI >> 0x38,0));
  }
  return true;
}

Assistant:

bool ExtraDataLoader::base__begin__technique ( 
        const technique__AttributeData& attributeData, 
		const COLLADAFW::UniqueId& uniqueId,
		COLLADAFW::Object* object )
    {
        // Get the extra data element handler.
        ExtraDataElementHandler& extraDataElementHandler = getFileLoader ()->getExtraDataElementHandler ();

        // Ask all handlers, if they want to have the data of the current extra tag.
        // (profile name, element name ("optics"), id (cameraId)) 
        const ExtraDataCallbackHandlerList& extraDataCallbackHandlerList = extraDataElementHandler.getExtraDataCallbackHandlerList ();
        size_t numHandlers = extraDataCallbackHandlerList.size ();
        for ( size_t i=0; i<numHandlers; ++i )
        {
            IExtraDataCallbackHandler* extraDataCallbackHandler = extraDataCallbackHandlerList[i];

            // Get the hash value of the current element.
            size_t level = 1;
            StringHash elementHash = getFileLoader ()->getElementHash ( level );

            // Get the profile name.
            const ParserChar* profileName = attributeData.profile;

            // Ask, if the current handler should parse the extra tags of the current element.
            bool parseElement = extraDataCallbackHandler->parseElement ( profileName, elementHash, uniqueId, object );

            // Store the flag in the list.
            extraDataElementHandler.setExtraDataCallbackHandlerCalling ( i, parseElement );
        }
        return true;
    }